

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void pnga_get_diag(Integer g_a,Integer g_v)

{
  undefined8 uVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  Integer icode;
  int iVar5;
  Integer IVar6;
  undefined8 *buf;
  char *pcVar7;
  undefined8 *puVar8;
  long lVar9;
  Integer iloA;
  long lVar10;
  long lVar11;
  long lVar12;
  bool bVar13;
  char *ptr;
  Integer ld;
  Integer hiA [2];
  Integer loA [2];
  Integer atype;
  Integer vtype;
  Integer vdims;
  Integer vndim;
  Integer vlo;
  Integer andim;
  Integer adims [2];
  _iterator_hdl hdl;
  char *local_3b8;
  long local_3b0;
  long local_3a8;
  long local_3a0;
  long local_398;
  long local_390;
  long local_388;
  Integer local_380;
  long local_378;
  long local_370;
  long local_368;
  Integer local_360;
  Integer local_358;
  long local_350;
  long local_348;
  long local_340;
  _iterator_hdl local_330;
  
  pnga_nodeid();
  pnga_nnodes();
  iVar2 = _ga_sync_end;
  bVar13 = _ga_sync_begin != 0;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar13) {
    pnga_sync();
  }
  pnga_check_handle(g_a,"ga_get_diag_");
  pnga_check_handle(g_v,"ga_get_diag_");
  pnga_inquire(g_a,&local_380,&local_350,&local_348);
  icode = local_380;
  pnga_inquire(g_v,&local_378,&local_368,&local_370);
  if (local_350 != 2) {
    pnga_error("ga_get_diag: wrong dimension for g_a.",local_350);
  }
  if (local_368 != 1) {
    pnga_error("ga_get_diag: wrong dimension for g_v.",local_368);
  }
  if (local_348 < local_340) {
    local_340 = local_348;
  }
  if (local_370 != local_340) {
    pnga_error("ga_get_diag: The size of the first array\'s diagonal is greater than the size of the second array."
               ,icode);
  }
  if (local_378 != local_380) {
    pnga_error("ga_get_diag: input global arrays do not have the same data type. Global array type ="
               ,local_380);
  }
  pnga_local_iterator_init(g_a,&local_330);
  iVar5 = pnga_local_iterator_next(&local_330,&local_398,&local_3a8,&local_3b8,&local_3b0);
  if (iVar5 != 0) {
    local_388 = icode + -0x3e9;
    do {
      lVar4 = local_390;
      lVar9 = local_398;
      lVar3 = local_3b0;
      pcVar7 = local_3b8;
      if (0 < local_398) {
        lVar10 = local_390;
        if (local_390 < local_398) {
          lVar10 = local_398;
        }
        lVar11 = local_3a0;
        if (local_3a8 < local_3a0) {
          lVar11 = local_3a8;
        }
        lVar12 = lVar11 - lVar10;
        if (lVar10 <= lVar11) {
          IVar6 = GAsizeof(icode);
          lVar11 = lVar12 + 1;
          buf = (undefined8 *)malloc(IVar6 * lVar11);
          if (buf == (undefined8 *)0x0) {
            pnga_error("ga_get_diag_:failed to allocate memory for the local buffer.",9999);
          }
          switch(local_388) {
          case 0:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 4 + (lVar10 - lVar9) * 4;
              lVar9 = 0;
              do {
                *(undefined4 *)((long)buf + lVar9 * 4) = *(undefined4 *)pcVar7;
                lVar9 = lVar9 + 1;
                pcVar7 = pcVar7 + lVar3 * 4 + 4;
              } while (lVar12 + 1 != lVar9);
            }
            break;
          case 1:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 8 + (lVar10 - lVar9) * 8;
              lVar9 = 0;
              do {
                buf[lVar9] = *(undefined8 *)pcVar7;
                lVar9 = lVar9 + 1;
                pcVar7 = pcVar7 + lVar3 * 8 + 8;
              } while (lVar12 + 1 != lVar9);
            }
            break;
          case 2:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 4 + (lVar10 - lVar9) * 4;
              lVar9 = 0;
              do {
                *(undefined4 *)((long)buf + lVar9 * 4) = *(undefined4 *)pcVar7;
                lVar9 = lVar9 + 1;
                pcVar7 = pcVar7 + lVar3 * 4 + 4;
              } while (lVar12 + 1 != lVar9);
            }
            break;
          case 3:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 8 + (lVar10 - lVar9) * 8;
              lVar9 = 0;
              do {
                buf[lVar9] = *(undefined8 *)pcVar7;
                lVar9 = lVar9 + 1;
                pcVar7 = pcVar7 + lVar3 * 8 + 8;
              } while (lVar12 + 1 != lVar9);
            }
            break;
          default:
            pnga_error("get_diagonal_zero: wrong data type:",icode);
            break;
          case 5:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 8 + (lVar10 - lVar9) * 8;
              lVar9 = 0;
              do {
                buf[lVar9] = *(undefined8 *)pcVar7;
                lVar9 = lVar9 + 1;
                pcVar7 = pcVar7 + lVar3 * 8 + 8;
              } while (lVar12 + 1 != lVar9);
            }
            break;
          case 6:
            if (-1 < lVar12) {
              pcVar7 = pcVar7 + (lVar10 - lVar4) * lVar3 * 0x10 + (lVar10 - lVar9) * 0x10;
              puVar8 = buf;
              do {
                uVar1 = *(undefined8 *)(pcVar7 + 8);
                *puVar8 = *(undefined8 *)pcVar7;
                puVar8[1] = uVar1;
                pcVar7 = pcVar7 + lVar3 * 0x10 + 0x10;
                puVar8 = puVar8 + 2;
                lVar11 = lVar11 + -1;
              } while (lVar11 != 0);
            }
          }
          pnga_put(g_v,&local_358,&local_360,buf,&local_360);
          free(buf);
        }
      }
      iVar5 = pnga_local_iterator_next(&local_330,&local_398,&local_3a8,&local_3b8,&local_3b0);
    } while (iVar5 != 0);
  }
  if (iVar2 != 0) {
    pnga_sync();
  }
  return;
}

Assistant:

void pnga_get_diag(Integer g_a, Integer g_v)
{
  Integer vndim, vdims, dim1, dim2, vtype, atype, type;
  Integer me = pnga_nodeid (), i, nproc = pnga_nnodes();
  Integer andim, adims[2];
  Integer loA[2], hiA[2], ld;
  Integer num_blocks_a;
  int local_sync_begin,local_sync_end;
  char *ptr;
  _iterator_hdl hdl;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  pnga_check_handle (g_a, "ga_get_diag_");
  pnga_check_handle (g_v, "ga_get_diag_");

  pnga_inquire (g_a, &atype, &andim, adims);
  dim1 = adims[0];
  dim2 = adims[1];
  type = atype;
  pnga_inquire (g_v, &vtype, &vndim, &vdims);

  /* Perform some error checking */
  if (andim != 2)
    pnga_error("ga_get_diag: wrong dimension for g_a.", andim);
  if (vndim != 1)
    pnga_error("ga_get_diag: wrong dimension for g_v.", vndim);

  if (vdims != GA_MIN (dim1, dim2))
    pnga_error
      ("ga_get_diag: The size of the first array's diagonal is greater than the size of the second array.",
       type);

  if (vtype != atype)
  {
    pnga_error
      ("ga_get_diag: input global arrays do not have the same data type. Global array type =",
       atype);
  }

#if 1
  pnga_local_iterator_init(g_a, &hdl);
  while (pnga_local_iterator_next(&hdl,loA,hiA,&ptr,&ld)) {
    sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
  }
#else
  num_blocks_a = pnga_total_blocks(g_a);

  if (num_blocks_a < 0) {
    pnga_distribution(g_a, me, loA, hiA);
    pnga_access_ptr(g_a, loA, hiA, &ptr, &ld);
    sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
    pnga_release_update(g_a, loA, hiA);
  } else {
    Integer idx;
    /* Simple block-cyclic data distribution */
    if (!pnga_uses_proc_grid(g_a)) {
      for (idx = me; idx < num_blocks_a; idx += nproc) {
        pnga_distribution(g_a, idx, loA, hiA);
        pnga_access_block_ptr(g_a, idx, &ptr, &ld);
        sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
        pnga_release_update_block(g_a, idx);
      }
    } else {
      /* Uses scalapack block-cyclic data distribution */
      Integer chk;
      Integer proc_index[MAXDIM], index[MAXDIM];
      Integer topology[MAXDIM];
      Integer blocks[MAXDIM], block_dims[MAXDIM];
      pnga_get_proc_index(g_a, me, proc_index);
      pnga_get_proc_index(g_a, me, index);
      pnga_get_block_info(g_a, blocks, block_dims);
      pnga_get_proc_grid(g_a, topology);
      while (index[andim-1] < blocks[andim-1]) {
        /* find bounding coordinates of block */
        chk = 1;
        for (i = 0; i < andim; i++) {
          loA[i] = index[i]*block_dims[i]+1;
          hiA[i] = (index[i] + 1)*block_dims[i];
          if (hiA[i] > adims[i]) hiA[i] = adims[i];
          if (hiA[i] < loA[i]) chk = 0;
        }
        if (chk) {
          pnga_access_block_grid_ptr(g_a, index, &ptr, &ld);
          sgai_get_diagonal_block(g_a, ptr, g_v, loA, hiA, ld, type);
          pnga_release_update_block_grid(g_a, index);
        }
        /* increment index to get next block on processor */
        index[0] += topology[0];
        for (i = 0; i < andim; i++) {
          if (index[i] >= blocks[i] && i<andim-1) {
            index[i] = proc_index[i];
            index[i+1] += topology[i+1];
          }
        }
      }
    }
  }
#endif

  if(local_sync_end)pnga_sync();
}